

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTreeWalker.cpp
# Opt level: O2

void __thiscall
GrcManager::WalkFeatureSettingsTree
          (GrcManager *this,RefAST *ast,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *vsta)

{
  bool fOverride;
  int munitPR;
  GrcSymbolTable *this_00;
  GrcMasterTable *this_01;
  pointer pGVar1;
  string staDescription;
  int iVar2;
  Symbol pGVar3;
  RefAST *pRVar4;
  undefined8 uStack_128;
  RefAST astT;
  _Alloc_hider local_118;
  RefAST astNextID;
  RefAST astValue;
  GdlSlotRefExpression *local_d0;
  RefCount<AST> local_c8;
  RefAST local_c0;
  RefAST local_b8;
  RefAST local_b0;
  RefAST local_a8;
  RefAST local_a0;
  Symbol local_98;
  string local_90;
  string local_70;
  string local_50 [32];
  
  AST::getFirstChild(ast->ref->ptr);
  AST::getText_abi_cxx11_((string *)&astT,(astNextID.ref)->ptr);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)vsta,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&astT);
  std::__cxx11::string::~string((string *)&astT);
  iVar2 = AST::getType(ast->ref->ptr);
  if (iVar2 == 4) {
    if ((ulong)((long)(vsta->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(vsta->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start) < 0x21) {
      std::__cxx11::string::string
                ((string *)&local_70,"Invalid feature statement",(allocator *)&astValue);
      local_a0 = (RefAST)ast->ref;
      if (local_a0.ref != (Ref *)0x0) {
        (local_a0.ref)->count = (local_a0.ref)->count + 1;
      }
      LineAndFile((GrpLineAndFile *)&astT,this,&local_a0);
      GrcErrorList::AddError(&g_errorList,0x47d,(GdlObject *)0x0,&local_70,(GrpLineAndFile *)&astT);
      std::__cxx11::string::~string((string *)&local_118);
      RefCount<AST>::~RefCount(&local_a0);
      std::__cxx11::string::~string((string *)&local_70);
      goto LAB_001a34f4;
    }
    this_00 = this->m_psymtbl;
    GrcStructName::GrcStructName((GrcStructName *)&astValue,vsta);
    local_a8 = (RefAST)ast->ref;
    if (local_a8.ref != (Ref *)0x0) {
      (local_a8.ref)->count = (local_a8.ref)->count + 1;
    }
    LineAndFile((GrpLineAndFile *)&astT,this,&local_a8);
    pGVar3 = GrcSymbolTable::AddSymbol
                       (this_00,(GrcStructName *)&astValue,ksymtFeatSetting,(GrpLineAndFile *)&astT)
    ;
    std::__cxx11::string::~string((string *)&local_118);
    RefCount<AST>::~RefCount(&local_a8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&astValue);
    AST::getNextSibling((astNextID.ref)->ptr);
    if ((astValue.ref == (Ref *)0x0) || ((astValue.ref)->ptr == (AST *)0x0)) {
      RefCount<AST>::~RefCount(&astValue);
      goto LAB_001a34f4;
    }
    iVar2 = AST::getType((astValue.ref)->ptr);
    local_98 = pGVar3;
    if (iVar2 == 0xd) {
      local_d0 = (GdlSlotRefExpression *)operator_new(0x60);
      AST::getText_abi_cxx11_(&local_90,(astValue.ref)->ptr);
      GdlSlotRefExpression::GdlSlotRefExpression(local_d0,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      local_b0 = (RefAST)ast->ref;
      if (local_b0.ref != (Ref *)0x0) {
        (local_b0.ref)->count = (local_b0.ref)->count + 1;
      }
      LineAndFile((GrpLineAndFile *)&astT,this,&local_b0);
      GrpLineAndFile::operator=((GrpLineAndFile *)&local_d0->field_0x8,(GrpLineAndFile *)&astT);
      std::__cxx11::string::~string((string *)&local_118);
      pRVar4 = &local_b0;
    }
    else {
      if (astValue.ref != (Ref *)0x0) {
        (astValue.ref)->count = (astValue.ref)->count + 1;
      }
      local_b8.ref = astValue.ref;
      local_d0 = (GdlSlotRefExpression *)WalkExpressionTree(this,&local_b8);
      pRVar4 = &local_b8;
    }
    RefCount<AST>::~RefCount(pRVar4);
    this_01 = this->m_mtbFeatures;
    pGVar1 = (this->m_venv).super__Vector_base<GrcEnv,_std::allocator<GrcEnv>_>._M_impl.
             super__Vector_impl_data._M_finish;
    iVar2 = pGVar1[-1].m_nPointRadius;
    munitPR = pGVar1[-1].m_mPrUnits;
    fOverride = pGVar1[-1].m_fAttrOverride;
    local_c0 = (RefAST)ast->ref;
    if (local_c0.ref != (Ref *)0x0) {
      (local_c0.ref)->count = (local_c0.ref)->count + 1;
    }
    LineAndFile((GrpLineAndFile *)&astT,this,&local_c0);
    std::__cxx11::string::string(local_50,"feature setting",(allocator *)((long)&uStack_128 + 7));
    staDescription._M_string_length = uStack_128;
    staDescription._M_dataplus._M_p = (pointer)local_50;
    staDescription.field_2._M_allocated_capacity = (size_type)astT.ref;
    staDescription.field_2._8_8_ = local_118._M_p;
    GrcMasterTable::AddItem
              (this_01,local_98,(GdlExpression *)local_d0,iVar2,munitPR,fOverride,
               (GrpLineAndFile *)&astT,staDescription);
    std::__cxx11::string::~string(local_50);
    std::__cxx11::string::~string((string *)&local_118);
    RefCount<AST>::~RefCount(&local_c0);
    pRVar4 = &astValue;
  }
  else {
    AST::getNextSibling((astNextID.ref)->ptr);
    while ((astT.ref != (Ref *)0x0 && ((astT.ref)->ptr != (AST *)0x0))) {
      (astT.ref)->count = (astT.ref)->count + 1;
      local_c8.ref = astT.ref;
      WalkFeatureSettingsTree(this,&local_c8,vsta);
      RefCount<AST>::~RefCount(&local_c8);
      AST::getNextSibling((astT.ref)->ptr);
      RefCount<AST>::operator=(&astT,&astValue);
      RefCount<AST>::~RefCount(&astValue);
    }
    pRVar4 = &astT;
  }
  RefCount<AST>::~RefCount(pRVar4);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::pop_back(vsta);
LAB_001a34f4:
  RefCount<AST>::~RefCount(&astNextID);
  return;
}

Assistant:

void GrcManager::WalkFeatureSettingsTree(RefAST ast, std::vector<std::string> & vsta)
{
	RefAST astNextID = ast->getFirstChild();
	vsta.push_back(astNextID->getText());

	if (ast->getType() == OP_EQ)
	{
		if (vsta.size() < 2)
		{
			g_errorList.AddError(1149, NULL,
				"Invalid feature statement",
				LineAndFile(ast));
			return;
		}

		Symbol psym = SymbolTable()->AddSymbol(GrcStructName(vsta), ksymtFeatSetting,
			LineAndFile(ast));

		RefAST astValue = astNextID->getNextSibling();
		if (!astValue)
			return;

		GdlExpression *pexpValue;
		if (astValue->getType() == IDENT)
		{
			//	A kludge, because this isn't a slot-ref expression, but that is the
			//	most convenient thing to hold a simple identifier until we can process it
			//	further (see the master table function that processes the features).
			pexpValue = new GdlSlotRefExpression(astValue->getText());
			pexpValue->SetLineAndFile(LineAndFile(ast));
		}
		else
		{
			pexpValue = WalkExpressionTree(astValue);
		}
		m_mtbFeatures->AddItem(psym, pexpValue,
			PointRadius(), PointRadiusUnits(), AttrOverride(), LineAndFile(ast),
			"feature setting");
	}
	else
	{
		Assert(ast->getType() == OP_DOT || ast->getType() == ZdotStruct);
		RefAST astT = astNextID->getNextSibling();
		while (astT)
		{
			WalkFeatureSettingsTree(astT, vsta);
			astT = astT->getNextSibling();
		}
	}

	vsta.pop_back();
}